

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

big_integer *
anon_unknown.dwarf_afea::merge_all<big_integer>
          (big_integer *__return_storage_ptr__,vector<big_integer,_std::allocator<big_integer>_> *v)

{
  big_integer *pbVar1;
  bool bVar2;
  pointer pbVar3;
  pointer other;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertHelper local_c8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  string local_b8;
  big_integer *local_98;
  big_integer ab;
  big_integer b;
  big_integer a;
  
  other = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
          super__Vector_impl_data._M_start;
  pbVar3 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_98 = __return_storage_ptr__;
  if (other == pbVar3) {
    __assert_fail("!v.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/maxLundin[P]BigInteger/big_integer_testing.cpp"
                  ,0x266,"T (anonymous namespace)::merge_all(std::vector<T>) [T = big_integer]");
  }
  do {
    pbVar1 = local_98;
    if ((ulong)((long)pbVar3 - (long)other) < 0x21) {
      big_integer::big_integer(local_98,other);
      return pbVar1;
    }
    extract_random_element<big_integer>(&a,v);
    extract_random_element<big_integer>(&b,v);
    operator*(&ab,&a,&b);
    operator/((big_integer *)&local_b8,&ab,&a);
    gtest_ar_.success_ = operator==((big_integer *)&local_b8,&b);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"ab / a == b","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/maxLundin[P]BigInteger/big_integer_testing.cpp"
                 ,0x25e,local_b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
LAB_00141e96:
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      std::__cxx11::string::~string((string *)&local_b8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_c0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      operator/((big_integer *)&local_b8,&ab,&b);
      bVar2 = operator==((big_integer *)&local_b8,&a);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_.success_ = bVar2;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8);
      if (!bVar2) {
        testing::Message::Message((Message *)&local_c0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_b8,(internal *)&gtest_ar_,(AssertionResult *)"ab / b == a","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/maxLundin[P]BigInteger/big_integer_testing.cpp"
                   ,0x25f,local_b8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
        goto LAB_00141e96;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      std::vector<big_integer,_std::allocator<big_integer>_>::push_back(v,&ab);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&ab);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&b);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&a);
    other = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
            super__Vector_impl_data._M_start;
    pbVar3 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

T merge_all(std::vector<T> v) {
        assert(!v.empty());

        while (v.size() >= 2)
            merge_two(v);

        return v[0];
    }